

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8272.cpp
# Opt level: O3

void __thiscall Intel::i8272::i8272::run_for(i8272 *this,Cycles cycles)

{
  Observer *pOVar1;
  bool bVar2;
  int timers_left;
  int iVar3;
  long lVar4;
  Drive *pDVar5;
  long lVar6;
  Drive *pDVar7;
  int c_1;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  IntType IVar12;
  int c;
  ulong uVar13;
  LogLine local_48;
  Drive *local_40;
  WrappedInt<Cycles> local_38;
  
  Storage::Disk::Controller::run_for((Controller *)this,cycles);
  if (this->is_sleeping_ == false) {
    lVar4 = this->delay_time_;
    if (0 < lVar4) {
      if (lVar4 - (long)cycles.super_WrappedInt<Cycles>.length_ == 0 ||
          lVar4 < (long)cycles.super_WrappedInt<Cycles>.length_) {
        this->delay_time_ = 0;
        posit_event(this,0x10);
      }
      else {
        this->delay_time_ = lVar4 - (long)cycles.super_WrappedInt<Cycles>.length_;
      }
    }
    iVar3 = this->drives_seeking_;
    if (iVar3 != 0) {
      pDVar7 = this->drives_;
      uVar13 = 0;
      local_40 = pDVar7;
      local_38 = cycles.super_WrappedInt<Cycles>.length_;
      do {
        if (pDVar7[uVar13].phase == Seeking) {
          pDVar7 = pDVar7 + uVar13;
          lVar4 = pDVar7->step_rate_counter + (long)cycles.super_WrappedInt<Cycles>.length_;
          lVar6 = (long)this->step_rate_time_ * 8000;
          pDVar7->step_rate_counter = lVar4 % lVar6;
          lVar4 = lVar4 / lVar6 + 1;
          do {
            lVar4 = lVar4 + -1;
            if (lVar4 == 0) goto LAB_00186052;
            bVar2 = (int)(uint)pDVar7->head_position <= pDVar7->target_head_position;
            local_48.stream_ = (FILE *)_stdout;
            fprintf(_stdout,"[%s] ","i8272");
            Log::Logger<(Log::Source)13>::LogLine::append
                      (&local_48,"Target %d versus believed %d",
                       (ulong)(uint)pDVar7->target_head_position,(ulong)pDVar7->head_position);
            fputc(10,(FILE *)local_48.stream_);
            (*(this->super_MFMController).super_Controller.super_Source._vptr_Source[8])
                      (this,uVar13 & 0xffffffff);
            pDVar5 = Storage::Disk::Controller::get_drive((Controller *)this);
            Storage::Disk::Drive::step(pDVar5,(HeadPosition)((uint)bVar2 * 8 + -4));
            if (-1 < pDVar7->target_head_position) {
              pDVar7->head_position = pDVar7->head_position + bVar2 * '\x02' + -1;
            }
            bVar2 = seek_is_satisfied(this,(int)uVar13);
          } while (!bVar2);
          pDVar7->phase = CompletedSeeking;
          this->drives_seeking_ = this->drives_seeking_ + -1;
LAB_00186052:
          iVar3 = iVar3 + -1;
          pDVar7 = local_40;
          cycles.super_WrappedInt<Cycles>.length_ = local_38;
          if (iVar3 == 0) break;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != 4);
    }
    iVar3 = this->head_timers_running_;
    if (iVar3 != 0) {
      uVar8 = 0;
      iVar9 = iVar3;
      do {
        uVar11 = uVar8 >> 1;
        uVar10 = uVar8 & 1;
        lVar4 = this->drives_[uVar11].head_unload_delay[uVar10];
        if (0 < lVar4) {
          IVar12 = lVar4 - (long)cycles.super_WrappedInt<Cycles>.length_;
          if (IVar12 == 0 || lVar4 < (long)cycles.super_WrappedInt<Cycles>.length_) {
            this->drives_[uVar11].head_is_loaded[uVar10] = false;
            iVar9 = iVar9 + -1;
            this->head_timers_running_ = iVar9;
            IVar12 = 0;
          }
          this->drives_[uVar11].head_unload_delay[uVar10] = IVar12;
          iVar3 = iVar3 + -1;
          if (iVar3 == 0) break;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != 8);
    }
    if (this->is_executing_ == true) {
      pDVar5 = Storage::Disk::Controller::get_drive((Controller *)this);
      bVar2 = Storage::Disk::Drive::get_is_ready(pDVar5);
      if (!bVar2) {
        posit_event(this,0x40);
      }
    }
    if ((this->delay_time_ == 0) && (this->drives_seeking_ == 0)) {
      bVar2 = this->head_timers_running_ == 0;
      this->is_sleeping_ = bVar2;
      if ((bVar2) &&
         (pOVar1 = (this->super_MFMController).super_Controller.super_Source.observer_,
         pOVar1 != (Observer *)0x0)) {
        uVar8 = (**(this->super_MFMController).super_Controller.super_Source._vptr_Source)(this);
        (**pOVar1->_vptr_Observer)(pOVar1,this,(ulong)uVar8);
      }
    }
    else {
      this->is_sleeping_ = false;
    }
  }
  return;
}

Assistant:

void i8272::run_for(Cycles cycles) {
	Storage::Disk::MFMController::run_for(cycles);

	if(is_sleeping_) return;

	// check for an expired timer
	if(delay_time_ > 0) {
		if(cycles.as_integral() >= delay_time_) {
			delay_time_ = 0;
			posit_event(int(Event8272::Timer));
		} else {
			delay_time_ -= cycles.as_integral();
		}
	}

	// update seek status of any drives presently seeking
	if(drives_seeking_) {
		int drives_left = drives_seeking_;
		for(int c = 0; c < 4; c++) {
			if(drives_[c].phase == Drive::Seeking) {
				drives_[c].step_rate_counter += cycles.as_integral();
				auto steps = drives_[c].step_rate_counter / (8000 * step_rate_time_);
				drives_[c].step_rate_counter %= (8000 * step_rate_time_);
				while(steps--) {
					// Perform a step.
					int direction = (drives_[c].target_head_position < drives_[c].head_position) ? -1 : 1;
					logger.info().append("Target %d versus believed %d", drives_[c].target_head_position, drives_[c].head_position);
					select_drive(c);
					get_drive().step(Storage::Disk::HeadPosition(direction));
					if(drives_[c].target_head_position >= 0) drives_[c].head_position += direction;

					// Check for completion.
					if(seek_is_satisfied(c)) {
						drives_[c].phase = Drive::CompletedSeeking;
						drives_seeking_--;
						break;
					}
				}

				drives_left--;
				if(!drives_left) break;
			}
		}
	}

	// check for any head unloads
	if(head_timers_running_) {
		int timers_left = head_timers_running_;
		for(int c = 0; c < 8; c++) {
			int drive = (c >> 1);
			int head = c&1;

			if(drives_[drive].head_unload_delay[head] > 0) {
				if(cycles.as_integral() >= drives_[drive].head_unload_delay[head]) {
					drives_[drive].head_unload_delay[head] = 0;
					drives_[drive].head_is_loaded[head] = false;
					head_timers_running_--;
				} else {
					drives_[drive].head_unload_delay[head] -= cycles.as_integral();
				}
				timers_left--;
				if(!timers_left) break;
			}
		}
	}

	// check for busy plus ready disabled
	if(is_executing_ && !get_drive().get_is_ready()) {
		posit_event(int(Event8272::NoLongerReady));
	}

	is_sleeping_ = !delay_time_ && !drives_seeking_ && !head_timers_running_;
	if(is_sleeping_) update_clocking_observer();
}